

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naivelog.cpp
# Opt level: O2

int __thiscall naivelog::get_currenttime(naivelog *this,char *datetime)

{
  tm *ptVar1;
  time_t local_20;
  time_t timep;
  
  time(&local_20);
  ptVar1 = localtime(&local_20);
  sprintf(datetime,"%4d-%02d-%02d %02d:%02d:%02d: ",(ulong)(ptVar1->tm_year + 0x76c),
          (ulong)(ptVar1->tm_mon + 1),(ulong)(uint)ptVar1->tm_mday,(ulong)(uint)ptVar1->tm_hour,
          (ulong)(uint)ptVar1->tm_min,(ulong)(uint)ptVar1->tm_sec);
  return 0;
}

Assistant:

int naivelog::get_currenttime(char *datetime)
{
    time_t timep;
    struct tm *p;

    time(&timep);
    p = localtime(&timep);
    sprintf(datetime, "%4d-%02d-%02d %02d:%02d:%02d: ", (1900 + p->tm_year), (1 + p->tm_mon), p->tm_mday, p->tm_hour, p->tm_min, p->tm_sec);
    return 0;
}